

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int valueFromExpr(sqlite3 *db,Expr *pExpr,u8 enc,u8 affinity,sqlite3_value **ppVal,
                 ValueNewStat4Ctx *pCtx)

{
  int *piVar1;
  ExprList *pEVar2;
  Expr *pExpr_00;
  Parse *pParse;
  u8 uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  FuncDef *pFVar8;
  sqlite3_value **p;
  sqlite3_value *pRec;
  sqlite3_value *pRec_00;
  void *pvVar9;
  MemValue MVar10;
  byte bVar11;
  long lVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  sqlite3_value *local_70;
  sqlite3_context local_68;
  
  local_70 = (Mem *)0x0;
  for (; (bVar11 = pExpr->op, bVar11 == 0xa6 || (bVar11 == 0xad)); pExpr = pExpr->pLeft) {
  }
  if (bVar11 == 0xa8) {
    bVar11 = pExpr->op2;
  }
  if (bVar11 == 0xa5) {
    pExpr = pExpr->pLeft;
    bVar11 = pExpr->op;
    if ((bVar11 | 2) != 0x93) {
      iVar6 = valueFromExpr(db,pExpr,enc,affinity,&local_70,pCtx);
      pRec = local_70;
      iVar5 = 0;
      if (local_70 != (Mem *)0x0 && iVar6 == 0) {
        sqlite3VdbeMemNumerify(local_70);
        if ((pRec->flags & 8) == 0) {
          (pRec->u).i = -(pRec->u).i;
        }
        else {
          (pRec->u).i = (pRec->u).i ^ 0x8000000000000000;
        }
        applyAffinity(pRec,affinity,enc);
      }
      goto LAB_0016d8fd;
    }
    pcVar13 = "-";
    lVar12 = -1;
  }
  else {
    if (bVar11 == 0x24) {
      uVar3 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
      iVar5 = valueFromExpr(db,pExpr->pLeft,enc,uVar3,ppVal,pCtx);
      if (*ppVal == (Mem *)0x0) {
        return iVar5;
      }
      sqlite3VdbeMemCast(*ppVal,uVar3,'\x01');
      applyAffinity(*ppVal,affinity,'\x01');
      return iVar5;
    }
    pcVar13 = "";
    lVar12 = 1;
  }
  if (bVar11 < 0x91) {
    if (bVar11 != 0x6e) {
      if (bVar11 == 0x72) {
        pRec = valueNew(db,pCtx);
        iVar5 = 0;
        if (pRec != (sqlite3_value *)0x0) {
          sqlite3VdbeMemNumerify(pRec);
          goto LAB_0016d8fd;
        }
        goto LAB_0016d760;
      }
LAB_0016d5ca:
      if ((pCtx == (ValueNewStat4Ctx *)0x0) || (bVar11 != 0xa1)) {
        if (bVar11 != 0x9f) {
          pRec = (sqlite3_value *)0x0;
          iVar5 = 0;
          goto LAB_0016d8fd;
        }
        pRec = valueNew(db,pCtx);
        iVar5 = 0;
        if (pRec != (sqlite3_value *)0x0) {
          pRec->flags = 4;
          MVar10.i._1_7_ = 0;
          MVar10.i._0_1_ = (pExpr->u).zToken[4] == '\0';
          pRec->u = MVar10;
          goto LAB_0016d8fd;
        }
      }
      else {
        pEVar2 = (pExpr->x).pList;
        iVar5 = 0;
        uVar14 = 0;
        if (pEVar2 != (ExprList *)0x0) {
          uVar14 = pEVar2->nExpr;
        }
        pFVar8 = sqlite3FindFunction(db,(pExpr->u).zToken,uVar14,enc,'\0');
        if ((char)((pFVar8->funcFlags & 0x20) >> 5) == '\0' && (pFVar8->funcFlags & 0x2800) != 0) {
          if (pEVar2 == (ExprList *)0x0) {
            p = (sqlite3_value **)0x0;
          }
          else {
            p = (sqlite3_value **)sqlite3DbMallocZero(db,(long)(int)uVar14 << 3);
            if (p == (sqlite3_value **)0x0) {
              iVar5 = 7;
              goto LAB_0016d8fb;
            }
            if (0 < (int)uVar14) {
              lVar12 = 0;
              do {
                pExpr_00 = *(Expr **)((long)&pEVar2->a[0].pExpr + lVar12 * 4);
                iVar5 = 0;
                if (pExpr_00 != (Expr *)0x0) {
                  iVar5 = valueFromExpr(db,pExpr_00,enc,affinity,
                                        (sqlite3_value **)((long)p + lVar12),(ValueNewStat4Ctx *)0x0
                                       );
                }
                if ((*(sqlite3_value **)((long)p + lVar12) == (sqlite3_value *)0x0) || (iVar5 != 0))
                {
                  pRec_00 = (sqlite3_value *)0x0;
                  goto LAB_0016d98a;
                }
                lVar12 = lVar12 + 8;
              } while ((ulong)uVar14 << 3 != lVar12);
            }
          }
          pRec_00 = valueNew(db,pCtx);
          if (pRec_00 == (sqlite3_value *)0x0) {
            iVar5 = 7;
            pRec = (sqlite3_value *)0x0;
          }
          else {
            local_68.iOp = 0;
            local_68.isError = 0;
            local_68.skipFlag = '\0';
            local_68.argc = '\0';
            local_68._42_6_ = 0;
            local_68.pMem = (Mem *)0x0;
            local_68.pVdbe = (Vdbe *)0x0;
            local_68.argv[0] = (sqlite3_value *)0x0;
            local_68.pOut = pRec_00;
            local_68.pFunc = pFVar8;
            (*pFVar8->xSFunc)(&local_68,uVar14,p);
            iVar5 = local_68.isError;
            if (local_68.isError == 0) {
              applyAffinity(pRec_00,affinity,'\x01');
              uVar4 = pRec_00->flags;
              if (((uVar4 & 2) != 0) && (pRec_00->enc != enc)) {
                iVar5 = sqlite3VdbeMemTranslate(pRec_00,enc);
                if (iVar5 != 0) goto LAB_0016d8d4;
                uVar4 = pRec_00->flags;
              }
              iVar5 = 0;
              if ((uVar4 & 0x12) != 0) {
                iVar6 = pRec_00->n;
                if ((uVar4 >> 0xe & 1) != 0) {
                  iVar6 = iVar6 + (pRec_00->u).nZero;
                }
                if (pRec_00->db->aLimit[0] < iVar6) {
                  piVar1 = &pCtx->pParse->nErr;
                  *piVar1 = *piVar1 + 1;
                  iVar5 = 0x12;
                }
              }
            }
            else {
              pParse = pCtx->pParse;
              pvVar9 = sqlite3ValueText(pRec_00,'\x01');
              sqlite3ErrorMsg(pParse,"%s",pvVar9);
            }
LAB_0016d8d4:
            pCtx->pParse->rc = iVar5;
LAB_0016d98a:
            pRec = (sqlite3_value *)0x0;
            if (iVar5 == 0) {
              pRec = pRec_00;
            }
          }
          if (p != (sqlite3_value **)0x0) {
            if (0 < (int)uVar14) {
              uVar15 = 0;
              do {
                sqlite3ValueFree(p[uVar15]);
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            sqlite3DbFreeNN(db,p);
          }
          goto LAB_0016d8fd;
        }
      }
LAB_0016d8fb:
      pRec = (sqlite3_value *)0x0;
      goto LAB_0016d8fd;
    }
LAB_0016d467:
    pRec = valueNew(db,pCtx);
    if (pRec != (sqlite3_value *)0x0) {
      if ((pExpr->flags & 0x400) == 0) {
        pcVar13 = sqlite3MPrintf(db,"%s%s",pcVar13,(pExpr->u).zToken);
        if (pcVar13 == (char *)0x0) goto LAB_0016d762;
        sqlite3VdbeMemSetStr(pRec,pcVar13,-1,'\x01',sqlite3MallocSize);
      }
      else {
        lVar12 = lVar12 * (pExpr->u).iValue;
        if ((pRec->flags & 0x2400) == 0) {
          (pRec->u).i = lVar12;
          pRec->flags = 4;
        }
        else {
          vdbeReleaseAndSetInt64(pRec,lVar12);
        }
      }
      uVar3 = 'C';
      if (affinity != 'A' || (bVar11 & 0xfd) != 0x91) {
        uVar3 = affinity;
      }
      applyAffinity(pRec,uVar3,'\x01');
      uVar4 = pRec->flags;
      if ((uVar4 & 0xc) != 0) {
        uVar4 = uVar4 & 0xfffd;
        pRec->flags = uVar4;
      }
      iVar5 = 0;
      if (((enc != '\x01') && ((uVar4 & 2) != 0)) && (pRec->enc != enc)) {
        iVar5 = sqlite3VdbeMemTranslate(pRec,enc);
      }
LAB_0016d8fd:
      *ppVal = pRec;
      return iVar5;
    }
  }
  else {
    if (bVar11 == 0x93) goto LAB_0016d467;
    if (bVar11 != 0x92) {
      if (bVar11 != 0x91) goto LAB_0016d5ca;
      goto LAB_0016d467;
    }
    pRec = valueNew(db,pCtx);
    iVar5 = 0;
    if (pRec != (sqlite3_value *)0x0) {
      pcVar13 = (pExpr->u).zToken;
      sVar7 = strlen(pcVar13 + 2);
      uVar14 = (uint)sVar7 & 0x3fffffff;
      iVar6 = uVar14 - 1;
      pcVar13 = (char *)sqlite3HexToBlob(db,pcVar13 + 2,iVar6);
      sqlite3VdbeMemSetStr
                (pRec,pcVar13,(int)((uVar14 - (iVar6 >> 0x1f)) + -1) >> 1,'\0',sqlite3MallocSize);
      goto LAB_0016d8fd;
    }
  }
LAB_0016d760:
  pRec = (sqlite3_value *)0x0;
LAB_0016d762:
  if (pCtx == (ValueNewStat4Ctx *)0x0) {
    sqlite3OomFault(db);
    sqlite3ValueFree(pRec);
  }
  else if (pCtx->pParse->nErr == 0) {
    sqlite3OomFault(db);
  }
  return 7;
}

Assistant:

static int valueFromExpr(
  sqlite3 *db,                    /* The database connection */
  Expr *pExpr,                    /* The expression to evaluate */
  u8 enc,                         /* Encoding to use */
  u8 affinity,                    /* Affinity to use */
  sqlite3_value **ppVal,          /* Write the new value here */
  struct ValueNewStat4Ctx *pCtx   /* Second argument for valueNew() */
){
  int op;
  char *zVal = 0;
  sqlite3_value *pVal = 0;
  int negInt = 1;
  const char *zNeg = "";
  int rc = SQLITE_OK;

  assert( pExpr!=0 );
  while( (op = pExpr->op)==TK_UPLUS || op==TK_SPAN ) pExpr = pExpr->pLeft;
#if defined(SQLITE_ENABLE_STAT3_OR_STAT4)
  if( op==TK_REGISTER ) op = pExpr->op2;
#else
  if( NEVER(op==TK_REGISTER) ) op = pExpr->op2;
#endif

  /* Compressed expressions only appear when parsing the DEFAULT clause
  ** on a table column definition, and hence only when pCtx==0.  This
  ** check ensures that an EP_TokenOnly expression is never passed down
  ** into valueFromFunction(). */
  assert( (pExpr->flags & EP_TokenOnly)==0 || pCtx==0 );

  if( op==TK_CAST ){
    u8 aff = sqlite3AffinityType(pExpr->u.zToken,0);
    rc = valueFromExpr(db, pExpr->pLeft, enc, aff, ppVal, pCtx);
    testcase( rc!=SQLITE_OK );
    if( *ppVal ){
      sqlite3VdbeMemCast(*ppVal, aff, SQLITE_UTF8);
      sqlite3ValueApplyAffinity(*ppVal, affinity, SQLITE_UTF8);
    }
    return rc;
  }

  /* Handle negative integers in a single step.  This is needed in the
  ** case when the value is -9223372036854775808.
  */
  if( op==TK_UMINUS
   && (pExpr->pLeft->op==TK_INTEGER || pExpr->pLeft->op==TK_FLOAT) ){
    pExpr = pExpr->pLeft;
    op = pExpr->op;
    negInt = -1;
    zNeg = "-";
  }

  if( op==TK_STRING || op==TK_FLOAT || op==TK_INTEGER ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    if( ExprHasProperty(pExpr, EP_IntValue) ){
      sqlite3VdbeMemSetInt64(pVal, (i64)pExpr->u.iValue*negInt);
    }else{
      zVal = sqlite3MPrintf(db, "%s%s", zNeg, pExpr->u.zToken);
      if( zVal==0 ) goto no_mem;
      sqlite3ValueSetStr(pVal, -1, zVal, SQLITE_UTF8, SQLITE_DYNAMIC);
    }
    if( (op==TK_INTEGER || op==TK_FLOAT ) && affinity==SQLITE_AFF_BLOB ){
      sqlite3ValueApplyAffinity(pVal, SQLITE_AFF_NUMERIC, SQLITE_UTF8);
    }else{
      sqlite3ValueApplyAffinity(pVal, affinity, SQLITE_UTF8);
    }
    if( pVal->flags & (MEM_Int|MEM_Real) ) pVal->flags &= ~MEM_Str;
    if( enc!=SQLITE_UTF8 ){
      rc = sqlite3VdbeChangeEncoding(pVal, enc);
    }
  }else if( op==TK_UMINUS ) {
    /* This branch happens for multiple negative signs.  Ex: -(-5) */
    if( SQLITE_OK==valueFromExpr(db,pExpr->pLeft,enc,affinity,&pVal,pCtx) 
     && pVal!=0
    ){
      sqlite3VdbeMemNumerify(pVal);
      if( pVal->flags & MEM_Real ){
        pVal->u.r = -pVal->u.r;
      }else if( pVal->u.i==SMALLEST_INT64 ){
        pVal->u.r = -(double)SMALLEST_INT64;
        MemSetTypeFlag(pVal, MEM_Real);
      }else{
        pVal->u.i = -pVal->u.i;
      }
      sqlite3ValueApplyAffinity(pVal, affinity, enc);
    }
  }else if( op==TK_NULL ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    sqlite3VdbeMemNumerify(pVal);
  }
#ifndef SQLITE_OMIT_BLOB_LITERAL
  else if( op==TK_BLOB ){
    int nVal;
    assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
    assert( pExpr->u.zToken[1]=='\'' );
    pVal = valueNew(db, pCtx);
    if( !pVal ) goto no_mem;
    zVal = &pExpr->u.zToken[2];
    nVal = sqlite3Strlen30(zVal)-1;
    assert( zVal[nVal]=='\'' );
    sqlite3VdbeMemSetStr(pVal, sqlite3HexToBlob(db, zVal, nVal), nVal/2,
                         0, SQLITE_DYNAMIC);
  }
#endif
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  else if( op==TK_FUNCTION && pCtx!=0 ){
    rc = valueFromFunction(db, pExpr, enc, affinity, &pVal, pCtx);
  }
#endif
  else if( op==TK_TRUEFALSE ){
    pVal = valueNew(db, pCtx);
    if( pVal ){
      pVal->flags = MEM_Int;
      pVal->u.i = pExpr->u.zToken[4]==0;
    }
  }

  *ppVal = pVal;
  return rc;

no_mem:
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 || pCtx->pParse->nErr==0 )
#endif
    sqlite3OomFault(db);
  sqlite3DbFree(db, zVal);
  assert( *ppVal==0 );
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 ) sqlite3ValueFree(pVal);
#else
  assert( pCtx==0 ); sqlite3ValueFree(pVal);
#endif
  return SQLITE_NOMEM_BKPT;
}